

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  undefined1 local_48 [8];
  TextGenerator generator;
  ZeroCopyOutputStream *output_local;
  Message *message_local;
  Printer *this_local;
  
  generator._32_8_ = output;
  TextGenerator::TextGenerator
            ((TextGenerator *)local_48,output,(bool)(this->insert_silent_marker_ & 1),
             this->initial_indent_level_);
  Print(this,message,(TextGenerator *)local_48);
  bVar1 = TextGenerator::failed((TextGenerator *)local_48);
  TextGenerator::~TextGenerator((TextGenerator *)local_48);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool TextFormat::Printer::Print(const Message& message,
                                io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, insert_silent_marker_, initial_indent_level_);

  Print(message, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}